

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketAcceptor::ThreadedSocketAcceptor
          (ThreadedSocketAcceptor *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings,LogFactory *logFactory)

{
  LogFactory *logFactory_local;
  SessionSettings *settings_local;
  MessageStoreFactory *factory_local;
  Application *application_local;
  ThreadedSocketAcceptor *this_local;
  
  Acceptor::Acceptor(&this->super_Acceptor,application,factory,settings,logFactory);
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__ThreadedSocketAcceptor_0030d658;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->m_sockets);
  std::
  map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
  ::map(&this->m_portToSessions);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (&this->m_socketToPort);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map(&this->m_threads);
  Mutex::Mutex(&this->m_mutex);
  socket_init();
  return;
}

Assistant:

ThreadedSocketAcceptor::ThreadedSocketAcceptor(
  Application& application,
  MessageStoreFactory& factory,
  const SessionSettings& settings,
  LogFactory& logFactory ) EXCEPT ( ConfigError )
: Acceptor( application, factory, settings, logFactory )
{
  socket_init();
}